

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

void __thiscall Response::Status::Status(Status *this,int code)

{
  int in_ESI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  *(int *)(in_RDI + 0x20) = in_ESI;
  if (in_ESI == 200) {
    std::__cxx11::string::operator=(in_RDI,"OK");
  }
  else if (in_ESI == 0x193) {
    std::__cxx11::string::operator=(in_RDI,"FORBIDDEN");
  }
  else if (in_ESI == 0x194) {
    std::__cxx11::string::operator=(in_RDI,"NOT FOUND");
  }
  else if (in_ESI == 0x195) {
    std::__cxx11::string::operator=(in_RDI,"METHOD NOT ALLOWED");
  }
  return;
}

Assistant:

Response::Status::Status(int code) : code(code) {
    switch (code) {
    case 200:
        status = "OK";
        break;
    case 403:
        status = "FORBIDDEN";
        break;
    case 404:
        status = "NOT FOUND";
        break;
    case 405:
        status = "METHOD NOT ALLOWED";
        break;
    }
}